

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::SelectCoinsSRD
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount target_value,CAmount change_fee,FastRandomContext *rng,int max_selection_weight)

{
  int iVar1;
  long lVar2;
  long lVar3;
  pointer puVar4;
  long lVar5;
  pointer puVar6;
  const_reference __x;
  unsigned_long uVar7;
  bool bVar8;
  int iVar9;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indexes;
  bilingual_str local_178;
  SelectionResult local_138;
  priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
  heap;
  SelectionResult result;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  result.m_algo = SRD;
  result.m_use_effective = false;
  result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  result.m_algo_completed = true;
  result.m_weight = 0;
  result.bump_fee_group_discount = 0;
  heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  result.m_target = target_value;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&indexes,((long)(utxo_pool->
                             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(utxo_pool->
                            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x68);
  uVar7 = 0;
  for (lVar5 = 0;
      (pointer)((long)indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar5) !=
      indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish; lVar5 = lVar5 + 8) {
    indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] = uVar7;
    uVar7 = uVar7 + 1;
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,FastRandomContext&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,rng);
  puVar4 = indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = 0;
  bVar8 = false;
  lVar5 = 0;
  puVar6 = indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (puVar6 == puVar4) {
      if (bVar8) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_178.original._M_dataplus._M_p = (pointer)&local_178.original.field_2;
        local_178.translated._M_string_length = 0;
        local_178.translated.field_2._8_8_ = 0;
        local_178.original.field_2._M_allocated_capacity = 0;
        local_178.original.field_2._8_8_ = 0;
        local_178.original._M_string_length = 0;
        local_178.translated._M_dataplus._M_p = (pointer)&local_178.translated.field_2;
        local_178.translated.field_2._M_allocated_capacity = 0;
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                   __return_storage_ptr__,&local_178);
        bilingual_str::~bilingual_str(&local_178);
      }
      goto LAB_008fa69f;
    }
    __x = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                    (utxo_pool,*puVar6);
    std::
    priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
    ::push(&heap,__x);
    lVar5 = lVar5 + *(long *)((long)&__x->m_value + (ulong)((__x->m_subtract_fee_outputs ^ 1) << 5))
    ;
    iVar9 = iVar9 + __x->m_weight;
    do {
      if (iVar9 <= max_selection_weight) break;
      lVar3 = *(long *)((long)&(heap.c.
                                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_value +
                       (ulong)(((heap.c.
                                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_subtract_fee_outputs
                               ^ 1) << 5));
      iVar1 = (heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_weight;
      std::
      priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
      ::pop(&heap);
      iVar9 = iVar9 - iVar1;
      lVar5 = lVar5 - lVar3;
      bVar8 = true;
    } while (heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    puVar6 = puVar6 + 1;
  } while (lVar5 < target_value + change_fee + 50000);
  while (heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         heap.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    SelectionResult::AddInput
              (&result,heap.c.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    std::
    priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
    ::pop(&heap);
  }
  SelectionResult::SelectionResult(&local_138,&result);
  std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
  _Variant_storage<1ul,wallet::SelectionResult>
            ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)__return_storage_ptr__
             ,&local_138);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_138);
LAB_008fa69f:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&heap.c);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&result);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> SelectCoinsSRD(const std::vector<OutputGroup>& utxo_pool, CAmount target_value, CAmount change_fee, FastRandomContext& rng,
                                             int max_selection_weight)
{
    SelectionResult result(target_value, SelectionAlgorithm::SRD);
    std::priority_queue<OutputGroup, std::vector<OutputGroup>, MinOutputGroupComparator> heap;

    // Include change for SRD as we want to avoid making really small change if the selection just
    // barely meets the target. Just use the lower bound change target instead of the randomly
    // generated one, since SRD will result in a random change amount anyway; avoid making the
    // target needlessly large.
    target_value += CHANGE_LOWER + change_fee;

    std::vector<size_t> indexes;
    indexes.resize(utxo_pool.size());
    std::iota(indexes.begin(), indexes.end(), 0);
    std::shuffle(indexes.begin(), indexes.end(), rng);

    CAmount selected_eff_value = 0;
    int weight = 0;
    bool max_tx_weight_exceeded = false;
    for (const size_t i : indexes) {
        const OutputGroup& group = utxo_pool.at(i);
        Assume(group.GetSelectionAmount() > 0);

        // Add group to selection
        heap.push(group);
        selected_eff_value += group.GetSelectionAmount();
        weight += group.m_weight;

        // If the selection weight exceeds the maximum allowed size, remove the least valuable inputs until we
        // are below max weight.
        if (weight > max_selection_weight) {
            max_tx_weight_exceeded = true; // mark it in case we don't find any useful result.
            do {
                const OutputGroup& to_remove_group = heap.top();
                selected_eff_value -= to_remove_group.GetSelectionAmount();
                weight -= to_remove_group.m_weight;
                heap.pop();
            } while (!heap.empty() && weight > max_selection_weight);
        }

        // Now check if we are above the target
        if (selected_eff_value >= target_value) {
            // Result found, add it.
            while (!heap.empty()) {
                result.AddInput(heap.top());
                heap.pop();
            }
            return result;
        }
    }
    return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
}